

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aio.c
# Opt level: O1

mraa_aio_context mraa_aio_init(uint aio)

{
  mraa_pininfo_t *pmVar1;
  mraa_adv_func_t *pmVar2;
  _func_mraa_result_t_uint *p_Var3;
  _func_mraa_result_t_mraa_aio_context *p_Var4;
  mraa_pin_t meta;
  mraa_boolean_t mVar5;
  mraa_result_t mVar6;
  mraa_aio_context dev;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  char *pcVar10;
  mraa_pin_t *pmVar11;
  int *piVar12;
  undefined8 *puVar13;
  mraa_board_t *pmVar14;
  byte bVar15;
  undefined8 auStackY_f8 [7];
  undefined1 in_stack_ffffffffffffff40 [40];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 in_stack_ffffffffffffff6c [56];
  undefined4 local_30;
  
  pmVar14 = plat;
  bVar15 = 0;
  if (plat == (mraa_board_t *)0x0) {
    pcVar10 = "aio: Platform not initialised";
LAB_0010f569:
    syslog(3,pcVar10);
    return (mraa_aio_context)0x0;
  }
  mVar5 = mraa_is_sub_platform_id(aio);
  if (mVar5 != 0) {
    syslog(5,"aio: Using sub platform");
    pmVar14 = pmVar14->sub_platform;
    if (pmVar14 == (mraa_board_t *)0x0) {
      pcVar10 = "aio: Sub platform Not Initialised";
      goto LAB_0010f569;
    }
    aio = mraa_get_sub_platform_index(aio);
  }
  if ((pmVar14->aio_non_seq == 0) || ((uint)pmVar14->aio_count <= aio)) {
    uVar8 = pmVar14->gpio_count + aio;
  }
  else {
    uVar8 = pmVar14->aio_dev[aio].pin;
  }
  uVar9 = (ulong)uVar8;
  if (((int)uVar8 < 0) || (pmVar14->phy_pin_count <= (int)uVar8)) {
    pcVar10 = "aio: pin %i beyond platform definition";
    goto LAB_0010f550;
  }
  if ((uint)pmVar14->aio_count <= aio) {
    pcVar10 = "aio: requested channel out of range";
    goto LAB_0010f569;
  }
  pmVar1 = pmVar14->pins;
  if (((uint)pmVar1[uVar9].capabilities & 0x40) == 0) {
    pcVar10 = "aio: pin %i not capable of aio";
    goto LAB_0010f550;
  }
  if (pmVar1[uVar9].aio.mux_total != 0) {
    pmVar11 = &pmVar1[uVar9].aio;
    piVar12 = (int *)&stack0xffffffffffffff70;
    for (lVar7 = 0x19; lVar7 != 0; lVar7 = lVar7 + -1) {
      *piVar12 = pmVar11->pinmap;
      pmVar11 = (mraa_pin_t *)((long)pmVar11 + (ulong)bVar15 * -8 + 4);
      piVar12 = piVar12 + (ulong)bVar15 * -2 + 1;
    }
    piVar12 = (int *)&stack0xffffffffffffff70;
    puVar13 = auStackY_f8;
    for (lVar7 = 0xc; lVar7 != 0; lVar7 = lVar7 + -1) {
      *puVar13 = *(undefined8 *)piVar12;
      piVar12 = piVar12 + ((ulong)bVar15 * -2 + 1) * 2;
      puVar13 = puVar13 + (ulong)bVar15 * -2 + 1;
    }
    meta.mux[2].pin = local_30;
    auVar16 = in_stack_ffffffffffffff40._12_12_;
    auVar17 = in_stack_ffffffffffffff40._24_12_;
    meta.pinmap = in_stack_ffffffffffffff40._0_4_;
    meta.parent_id = in_stack_ffffffffffffff40._4_4_;
    meta.mux_total = in_stack_ffffffffffffff40._8_4_;
    meta.mux[0].pincmd = auVar16._0_4_;
    meta.mux[0].pin = auVar16._4_4_;
    meta.mux[0].value = auVar16._8_4_;
    meta.mux[1].pincmd = auVar17._0_4_;
    meta.mux[1].pin = auVar17._4_4_;
    meta.mux[1].value = auVar17._8_4_;
    meta.mux[2].pincmd = in_stack_ffffffffffffff40._36_4_;
    auVar16 = in_stack_ffffffffffffff6c._4_12_;
    auVar17 = in_stack_ffffffffffffff6c._16_12_;
    auVar18 = in_stack_ffffffffffffff6c._28_12_;
    meta.mux[2].value = in_stack_ffffffffffffff6c._0_4_;
    meta.mux[3].pincmd = auVar16._0_4_;
    meta.mux[3].pin = auVar16._4_4_;
    meta.mux[3].value = auVar16._8_4_;
    meta.mux[4].pincmd = auVar17._0_4_;
    meta.mux[4].pin = auVar17._4_4_;
    meta.mux[4].value = auVar17._8_4_;
    meta.mux[5].pincmd = auVar18._0_4_;
    meta.mux[5].pin = auVar18._4_4_;
    meta.mux[5].value = auVar18._8_4_;
    meta.output_enable = in_stack_ffffffffffffff6c._40_4_;
    meta.complex_cap = (mraa_pin_cap_complex_t)in_stack_ffffffffffffff6c._44_4_;
    meta.gpio_chip = in_stack_ffffffffffffff6c._48_4_;
    meta.gpio_line = in_stack_ffffffffffffff6c._52_4_;
    mVar6 = mraa_setup_mux_mapped(meta);
    if (mVar6 != MRAA_SUCCESS) {
      pcVar10 = "aio: unable to setup multiplexers for pin";
      goto LAB_0010f569;
    }
  }
  pmVar2 = pmVar14->adv_func;
  uVar8 = pmVar14->pins[uVar9].aio.pinmap;
  dev = (mraa_aio_context)calloc(1,0x18);
  if (dev == (mraa_aio_context)0x0) {
LAB_0010f637:
    dev = (mraa_aio_context)0x0;
  }
  else {
    dev->advance_func = pmVar2;
    if ((pmVar2 == (mraa_adv_func_t *)0x0) ||
       (pmVar2->aio_init_internal_replace == (_func_mraa_result_t_mraa_aio_context_int *)0x0)) {
      dev->channel = uVar8;
      mVar6 = aio_get_valid_fp(dev);
    }
    else {
      mVar6 = (*pmVar2->aio_init_internal_replace)(dev,aio);
    }
    if (mVar6 != MRAA_SUCCESS) {
      free(dev);
      goto LAB_0010f637;
    }
  }
  if (dev != (mraa_aio_context)0x0) {
    raw_bits = mraa_adc_raw_bits();
    mraa_aio_set_bit(dev,10);
    if (((dev->advance_func == (mraa_adv_func_t *)0x0) ||
        (p_Var3 = dev->advance_func->aio_init_pre, p_Var3 == (_func_mraa_result_t_uint *)0x0)) ||
       (mVar6 = (*p_Var3)(aio), mVar6 == MRAA_SUCCESS)) {
      if (dev->advance_func == (mraa_adv_func_t *)0x0) {
        return dev;
      }
      p_Var4 = dev->advance_func->aio_init_post;
      if (p_Var4 == (_func_mraa_result_t_mraa_aio_context *)0x0) {
        return dev;
      }
      mVar6 = (*p_Var4)(dev);
      if (mVar6 == MRAA_SUCCESS) {
        return dev;
      }
    }
    free(dev);
    return (mraa_aio_context)0x0;
  }
  pcVar10 = "aio: Insufficient memory for specified input channel %d";
  uVar9 = (ulong)aio;
LAB_0010f550:
  syslog(3,pcVar10,uVar9);
  return (mraa_aio_context)0x0;
}

Assistant:

mraa_aio_context
mraa_aio_init(unsigned int aio)
{
    mraa_board_t* board = plat;
    int pin;
    if (board == NULL) {
        syslog(LOG_ERR, "aio: Platform not initialised");
        return NULL;
    }
    if (mraa_is_sub_platform_id(aio)) {
        syslog(LOG_NOTICE, "aio: Using sub platform");
        board = board->sub_platform;
        if (board == NULL) {
            syslog(LOG_ERR, "aio: Sub platform Not Initialised");
            return NULL;
        }
        aio = mraa_get_sub_platform_index(aio);
    }

    // Some boards, like the BBB, don't have sequential AIO pins
    // They will have their own specific mapping to map aio -> pin
    if((board->aio_non_seq) && (aio < board->aio_count)){
        pin = board->aio_dev[aio].pin;
    } else {
        // aio are always past the gpio_count in the pin array
        pin = aio + board->gpio_count;
    }

    if (pin < 0 || pin >= board->phy_pin_count) {
        syslog(LOG_ERR, "aio: pin %i beyond platform definition", pin);
        return NULL;
    }
    if (aio >= board->aio_count) {
        syslog(LOG_ERR, "aio: requested channel out of range");
        return NULL;
    }
    if (board->pins[pin].capabilities.aio != 1) {
        syslog(LOG_ERR, "aio: pin %i not capable of aio", pin);
        return NULL;
    }
    if (board->pins[pin].aio.mux_total > 0) {
        if (mraa_setup_mux_mapped(board->pins[pin].aio) != MRAA_SUCCESS) {
            syslog(LOG_ERR, "aio: unable to setup multiplexers for pin");
            return NULL;
        }
    }

    // Create ADC device connected to specified channel
    mraa_aio_context dev = mraa_aio_init_internal(board->adv_func, aio, board->pins[pin].aio.pinmap);
    if (dev == NULL) {
        syslog(LOG_ERR, "aio: Insufficient memory for specified input channel %d", aio);
        return NULL;
    }

    raw_bits = mraa_adc_raw_bits();
    mraa_aio_set_bit(dev, DEFAULT_BITS);

    if (IS_FUNC_DEFINED(dev, aio_init_pre)) {
        mraa_result_t pre_ret = (dev->advance_func->aio_init_pre(aio));
        if (pre_ret != MRAA_SUCCESS) {
            free(dev);
            return NULL;
        }
    }

    if (IS_FUNC_DEFINED(dev, aio_init_post)) {
        mraa_result_t ret = dev->advance_func->aio_init_post(dev);
        if (ret != MRAA_SUCCESS) {
            free(dev);
            return NULL;
        }
    }

    return dev;
}